

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_DoublingFactorCounterTest_ThreeQuads_Test::testBody
          (TEST_DoublingFactorCounterTest_ThreeQuads_Test *this)

{
  set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *this_00;
  size_type sVar1;
  UtestShell *pUVar2;
  size_type sVar3;
  char *pcVar4;
  char *pcVar5;
  SimpleString local_d0;
  SimpleString local_c8;
  TestTerminatorWithoutExceptions local_c0;
  key_type local_b4;
  DoublingFactorReport r;
  
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,WestWind);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addQuad
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,ThreeOfCharacters,false)
  ;
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addQuad
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,FourOfCircles,true);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addQuad
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,FiveOfBamboos,true);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,SevenOfCharacters,false)
  ;
  mahjong::WiningState::selfDrawn
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s,
             (SelfDrawnSituation)0x0);
  mahjong::DoubligFactorCounter::report
            (&r,&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c);
  this_00 = &r.patterns;
  local_d0.buffer_._0_4_ = 0x1e;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count(this_00,(key_type *)&local_d0);
  if (sVar1 == 1) {
    pUVar2 = UtestShell::getCurrent();
    local_d0.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x19e,&local_d0);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_d0);
  }
  else {
    local_d0.buffer_._0_4_ = 0x1e;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count(this_00,(key_type *)&local_d0);
    local_c8.buffer_._0_4_ = 0x1e;
    sVar3 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count(this_00,(key_type *)&local_c8);
    if (sVar1 != sVar3) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x19e);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom((int)&local_d0);
    pcVar4 = SimpleString::asCharString(&local_d0);
    local_b4 = ThreeQuads;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count(this_00,&local_b4);
    StringFrom((unsigned_long)&local_c8);
    pcVar5 = SimpleString::asCharString(&local_c8);
    local_c0.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x19e,&local_c0);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_c0);
    SimpleString::~SimpleString(&local_c8);
    SimpleString::~SimpleString(&local_d0);
  }
  if (r.doubling_factor == 2) {
    pUVar2 = UtestShell::getCurrent();
    local_d0.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x19f,&local_d0);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_d0);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    StringFrom((int)&local_d0);
    pcVar4 = SimpleString::asCharString(&local_d0);
    StringFrom((int)&local_c8);
    pcVar5 = SimpleString::asCharString(&local_c8);
    local_c0.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x19f,&local_c0);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_c0);
    SimpleString::~SimpleString(&local_c8);
    SimpleString::~SimpleString(&local_d0);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport(&r);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, ThreeQuads)
{
	addPair(Tile::WestWind);
	addQuad(Tile::ThreeOfCharacters, false);
	addQuad(Tile::FourOfCircles, true);
	addQuad(Tile::FiveOfBamboos, true);
	addSequence(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeQuads));
	CHECK_EQUAL(2, r.doubling_factor);
}